

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DefaultInstanceName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  ClassName_abi_cxx11_(&local_30,this,descriptor);
  std::operator+(&local_50,"_",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"_default_instance_");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultInstanceName(const Descriptor* descriptor,
                                const Options& options) {
  return "_" + ClassName(descriptor, false) + "_default_instance_";
}